

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

void page_release(bfy_page *page)

{
  if (page->unref_cb != (bfy_unref_cb *)0x0) {
    (*page->unref_cb)(page->data,page->size,page->unref_arg);
  }
  if ((page->flags & 3) == 0) {
    page_realloc(page,0);
  }
  *(undefined8 *)&page->flags = 0;
  page->unref_cb = (bfy_unref_cb *)0x0;
  page->read_pos = 0;
  page->write_pos = 0;
  page->data = (int8_t *)0x0;
  page->size = 0;
  page->unref_arg = (void *)0x0;
  return;
}

Assistant:

static void
page_release(struct bfy_page* page) {
    if (page->unref_cb != NULL) {
        page->unref_cb(page->data, page->size, page->unref_arg);
    }
    if (page_can_realloc(page)) {
        page_realloc(page, 0);
    }
    *page = InitPage;
}